

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot.c
# Opt level: O3

void spot_moveCards(Spot *fromSpot,uchar fromCardsIndex,uchar cardsToMoveCount,Spot *toSpot,
                   uchar toCardsIndex,_Bool reverseCards)

{
  byte bVar1;
  Card **ppCVar2;
  int iVar3;
  undefined7 in_register_00000011;
  Card **__ptr;
  char cVar4;
  
  bVar1 = toSpot->cardsCount;
  iVar3 = (int)CONCAT71(in_register_00000011,cardsToMoveCount);
  ppCVar2 = (Card **)realloc(toSpot->cards,(ulong)(((uint)bVar1 + iVar3) * 8));
  toSpot->cards = ppCVar2;
  if (bVar1 <= toCardsIndex) {
    __ptr = fromSpot->cards;
    memcpy(ppCVar2 + toCardsIndex,__ptr + fromCardsIndex,(ulong)(uint)(iVar3 << 3));
    if (reverseCards) {
      cards_reverse(ppCVar2 + toCardsIndex,cardsToMoveCount);
      __ptr = fromSpot->cards;
    }
    toSpot->cardsCount = toSpot->cardsCount + cardsToMoveCount;
    bVar1 = fromSpot->cardsCount - cardsToMoveCount;
    fromSpot->cardsCount = bVar1;
    ppCVar2 = (Card **)realloc(__ptr,(ulong)bVar1 << 3);
    fromSpot->cards = ppCVar2;
    return;
  }
  cVar4 = bVar1 - toCardsIndex;
  if (bVar1 < toCardsIndex) {
    cVar4 = '\0';
  }
  printf("TODO!! INSERTING cards, so displacing %d cards in destination\n",cVar4);
  exit(1);
}

Assistant:

void spot_moveCards(Spot * fromSpot, unsigned char fromCardsIndex, unsigned char cardsToMoveCount, Spot * toSpot, unsigned char toCardsIndex, bool reverseCards)
{
	unsigned char displacedCardsCount = toSpot->cardsCount>0 && toCardsIndex<toSpot->cardsCount ? toSpot->cardsCount-toCardsIndex : 0;
	//printf("%d from %s%d %d to %s%d %d\n", cardsToMoveCount, fromSpot->name, fromSpot->index, fromCardsIndex, toSpot->name, toSpot->index, toCardsIndex);

	toSpot->cards = (Card **)realloc(toSpot->cards, sizeof(Card *)*(cardsToMoveCount+toSpot->cardsCount));
	if(displacedCardsCount>0)
	{
		printf("TODO!! INSERTING cards, so displacing %d cards in destination\n", displacedCardsCount);
		exit(EXIT_FAILURE);
		//memcpy(toSpot->cards+(sizeof(Card *)*((toSpot->cardsCount-toCardsIndex)+cardsToMoveCount)), toSpot->cards+(sizeof(Card *)*(toSpot->cardsCount-toCardsIndex)));
	}

	memcpy(&toSpot->cards[toCardsIndex], &fromSpot->cards[fromCardsIndex], sizeof(Card *)*cardsToMoveCount);
	if(reverseCards)
		cards_reverse(&toSpot->cards[toCardsIndex], cardsToMoveCount);
	toSpot->cardsCount+=cardsToMoveCount;

	fromSpot->cardsCount-=cardsToMoveCount;
	fromSpot->cards = (Card **)realloc(fromSpot->cards, sizeof(Card *)*fromSpot->cardsCount);
}